

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall ThreadPool::add(ThreadPool *this,AbstractTaskProvider *provider,size_t taskCount)

{
  undefined8 uVar1;
  size_t sVar2;
  size_type in_RDX;
  list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *in_RSI;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RDI;
  _List_node_base **this_00;
  mutex *in_stack_ffffffffffffff90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb8;
  imageException *in_stack_ffffffffffffffc0;
  iterator local_38;
  _List_const_iterator<AbstractTaskProvider_*> local_30 [2];
  value_type *in_stack_ffffffffffffffe0;
  const_iterator __position;
  
  if (in_RDX == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  __position._M_node = (_List_node_base *)in_RDI._M_current;
  sVar2 = threadCount((ThreadPool *)0x130077);
  if (sVar2 == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  std::mutex::lock(in_stack_ffffffffffffff90);
  *(undefined1 *)
   &in_RSI[1].super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = 1;
  std::mutex::unlock((mutex *)0x1300fa);
  std::mutex::lock(in_stack_ffffffffffffff90);
  this_00 = &((_List_node_base *)((long)in_RDI._M_current + 0xe0))->_M_prev;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::end
                 ((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)this_00);
  std::_List_const_iterator<AbstractTaskProvider_*>::_List_const_iterator(local_30,&local_38);
  std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::insert
            (in_RSI,__position,in_RDX,in_stack_ffffffffffffffe0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
            (in_RDI,in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90);
  std::condition_variable::notify_all();
  std::mutex::unlock((mutex *)0x1301bb);
  return;
}

Assistant:

void ThreadPool::add( AbstractTaskProvider * provider, size_t taskCount )
{
    if( taskCount == 0 )
        throw imageException( "Try to add zero tasks to thread pool" );

    if( threadCount() == 0 )
        throw imageException( "No threads in thread pool" );

    provider->_completion.lock();
    provider->_running = true;
    provider->_completion.unlock();

    _taskInfo.lock();

    _task.insert( _task.end(), taskCount, provider );

    std::fill( _run.begin(), _run.end(), 1 );
    _waiting.notify_all();

    _taskInfo.unlock();
}